

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void * anon_unknown.dwarf_5370::do_malloc_pages(ThreadCache *heap,size_t size)

{
  bool bVar1;
  Length n;
  PageHeap *this;
  Span *pSVar2;
  Length local_48;
  Span *span;
  Length num_pages;
  void *result;
  size_t size_local;
  ThreadCache *heap_local;
  
  n = tcmalloc::pages(size);
  bVar1 = tcmalloc::ThreadCache::SampleAllocation(heap,size);
  if (bVar1) {
    num_pages = (Length)DoSampledAllocation(size);
  }
  else {
    this = tcmalloc::Static::pageheap();
    pSVar2 = tcmalloc::PageHeap::New(this,n);
    if (pSVar2 == (Span *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = pSVar2->start << 0xd;
    }
    num_pages = local_48;
  }
  bVar1 = should_report_large(n);
  if (bVar1) {
    ReportLargeAlloc(n,(void *)num_pages);
  }
  return (void *)num_pages;
}

Assistant:

static void* do_malloc_pages(ThreadCache* heap, size_t size) {
  void* result;

  Length num_pages = tcmalloc::pages(size);

  // NOTE: we're passing original size here as opposed to rounded-up
  // size as we do in do_malloc_small. The difference is small here
  // (at most 4k out of at least 256k). And not rounding up saves us
  // from possibility of overflow, which rounding up could produce.
  //
  // See https://github.com/gperftools/gperftools/issues/723
  if (heap->SampleAllocation(size)) {
    result = DoSampledAllocation(size);
  } else {
    Span* span = Static::pageheap()->New(num_pages);
    result = (PREDICT_FALSE(span == nullptr) ? nullptr : SpanToMallocResult(span));
  }

  if (should_report_large(num_pages)) {
    ReportLargeAlloc(num_pages, result);
  }
  return result;
}